

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall pugi::xml_document::_create(xml_document *this)

{
  xml_node_struct *pxVar1;
  xml_memory_page *page_00;
  xml_node_struct *local_30;
  xml_memory_page *page;
  size_t page_offset;
  xml_document *this_local;
  
  if ((this->super_xml_node)._root != (xml_node_struct *)0x0) {
    __assert_fail("!_root",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                  ,0x1ae4,"void pugi::xml_document::_create()");
  }
  page_00 = impl::anon_unknown_0::xml_memory_page::construct(this->_memory);
  if (page_00 != (xml_memory_page *)0x0) {
    page_00->busy_size = 0x7fd8;
    impl::anon_unknown_0::xml_document_struct::xml_document_struct
              ((xml_document_struct *)(page_00 + 1),page_00);
    (this->super_xml_node)._root = (xml_node_struct *)(page_00 + 1);
    ((this->super_xml_node)._root)->prev_sibling_c = (this->super_xml_node)._root;
    pxVar1 = (this->super_xml_node)._root;
    local_30 = (xml_node_struct *)0x0;
    if (pxVar1 != (xml_node_struct *)0x0) {
      local_30 = pxVar1 + 1;
    }
    page_00->allocator = (xml_allocator *)local_30;
    if (&(this->super_xml_node)._root[1].first_child <= this + 1) {
      return;
    }
    __assert_fail("reinterpret_cast<char*>(_root) + sizeof(impl::xml_document_struct) <= _memory + sizeof(_memory)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                  ,0x1b0a,"void pugi::xml_document::_create()");
  }
  __assert_fail("page",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                ,0x1af2,"void pugi::xml_document::_create()");
}

Assistant:

PUGI__FN void xml_document::_create()
	{
		assert(!_root);

	#ifdef PUGIXML_COMPACT
		// space for page marker for the first page (uint32_t), rounded up to pointer size; assumes pointers are at least 32-bit
		const size_t page_offset = sizeof(void*);
	#else
		const size_t page_offset = 0;
	#endif

		// initialize sentinel page
		PUGI__STATIC_ASSERT(sizeof(impl::xml_memory_page) + sizeof(impl::xml_document_struct) + page_offset <= sizeof(_memory));

		// prepare page structure
		impl::xml_memory_page* page = impl::xml_memory_page::construct(_memory);
		assert(page);

		page->busy_size = impl::xml_memory_page_size;

		// setup first page marker
	#ifdef PUGIXML_COMPACT
		// round-trip through void* to avoid 'cast increases required alignment of target type' warning
		page->compact_page_marker = reinterpret_cast<uint32_t*>(static_cast<void*>(reinterpret_cast<char*>(page) + sizeof(impl::xml_memory_page)));
		*page->compact_page_marker = sizeof(impl::xml_memory_page);
	#endif

		// allocate new root
		_root = new (reinterpret_cast<char*>(page) + sizeof(impl::xml_memory_page) + page_offset) impl::xml_document_struct(page);
		_root->prev_sibling_c = _root;

		// setup sentinel page
		page->allocator = static_cast<impl::xml_document_struct*>(_root);

		// setup hash table pointer in allocator
	#ifdef PUGIXML_COMPACT
		page->allocator->_hash = &static_cast<impl::xml_document_struct*>(_root)->hash;
	#endif

		// verify the document allocation
		assert(reinterpret_cast<char*>(_root) + sizeof(impl::xml_document_struct) <= _memory + sizeof(_memory));
	}